

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O2

qint64 __thiscall
QHttpNetworkReplyPrivate::readHeader(QHttpNetworkReplyPrivate *this,QIODevice *socket)

{
  QHttpNetworkHeaderPrivate *this_00;
  QByteArray *this_01;
  QHttpHeaderParser *this_02;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  qsizetype qVar5;
  long lVar6;
  qint64 qVar7;
  qint64 qVar8;
  long in_FS_OFFSET;
  QByteArrayView bv;
  QByteArrayView bv_00;
  QByteArrayView bv_01;
  QByteArrayView bv_02;
  QByteArrayView header;
  QByteArrayView bv_03;
  QByteArrayView bv_04;
  QByteArrayView bv_05;
  QByteArrayView bv_06;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QByteArrayView name_02;
  QArrayDataPointer<char> local_118;
  QArrayDataPointer<char> local_f8;
  QArrayDataPointer<char> local_e0;
  QArrayDataPointer<char> local_c8;
  QArrayDataPointer<char> local_b0;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  char c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &this->fragment;
  if ((this->fragment).d.size == 0) {
    QByteArray::reserve(this_01,0x200);
  }
  c = '\0';
  qVar8 = 0;
  bVar2 = false;
  while( true ) {
    lVar4 = QIODevice::read((char *)socket,(longlong)&c);
    if (lVar4 == -1) {
      qVar8 = -1;
      goto LAB_001f5474;
    }
    if (lVar4 == 0) break;
    QByteArray::append((char)this_01);
    qVar8 = qVar8 + 1;
    if (c == '\n') {
      qVar5 = QByteArrayView::lengthHelperCharArray("\n\r\n",4);
      bv.m_data = "\n\r\n";
      bv.m_size = qVar5;
      bVar1 = QByteArray::endsWith(this_01,bv);
      if (bVar1) {
LAB_001f516c:
        bVar2 = true;
      }
      else {
        qVar5 = QByteArrayView::lengthHelperCharArray("\n\n",3);
        bv_00.m_data = "\n\n";
        bv_00.m_size = qVar5;
        bVar1 = QByteArray::endsWith(this_01,bv_00);
        if (bVar1) goto LAB_001f516c;
      }
      lVar6 = (this->fragment).d.size;
      if (lVar6 == 2) {
        qVar5 = QByteArrayView::lengthHelperCharArray("\r\n",3);
        bv_01.m_data = "\r\n";
        bv_01.m_size = qVar5;
        bVar1 = QByteArray::endsWith(this_01,bv_01);
        if (bVar1) goto LAB_001f51f4;
        lVar6 = (this->fragment).d.size;
      }
      if (lVar6 == 1) {
        qVar5 = QByteArrayView::lengthHelperCharArray("\n",2);
        bv_02.m_data = "\n";
        bv_02.m_size = qVar5;
        bVar1 = QByteArray::endsWith(this_01,bv_02);
        if (bVar1) goto LAB_001f51f4;
      }
    }
    if ((lVar4 < 1) || (bVar2)) break;
  }
  if (!bVar2) goto LAB_001f5474;
LAB_001f51f4:
  this_02 = &(this->super_QHttpNetworkHeaderPrivate).parser;
  header.m_data = (this->fragment).d.ptr;
  header.m_size = (this->fragment).d.size;
  QHttpHeaderParser::parseHeaders(this_02,header);
  this->state = ReadingDataState;
  QByteArray::clear();
  this_00 = &this->super_QHttpNetworkHeaderPrivate;
  qVar7 = QHttpNetworkHeaderPrivate::contentLength(this_00);
  this->bodyLength = qVar7;
  qVar5 = QByteArrayView::lengthHelperCharArray("transfer-encoding",0x12);
  local_98.d = (Data *)0x0;
  local_98.ptr = (char *)0x0;
  local_98.size = 0;
  name.m_data = "transfer-encoding";
  name.m_size = qVar5;
  QHttpNetworkHeaderPrivate::headerField
            ((QByteArray *)&local_78,this_00,name,(QByteArray *)&local_98);
  QByteArray::toLower_helper((QByteArray *)&local_58);
  qVar5 = QByteArrayView::lengthHelperCharArray("chunked",8);
  bv_03.m_data = "chunked";
  bv_03.m_size = qVar5;
  bVar2 = QByteArray::contains((QByteArray *)&local_58,bv_03);
  this->chunkedTransferEncoding = bVar2;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  qVar5 = QByteArrayView::lengthHelperCharArray("connection",0xb);
  local_78.d = (Data *)0x0;
  local_78.ptr = (char *)0x0;
  local_78.size = 0;
  name_00.m_data = "connection";
  name_00.m_size = qVar5;
  QHttpNetworkHeaderPrivate::headerField
            ((QByteArray *)&local_58,this_00,name_00,(QByteArray *)&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QByteArray::toLower_helper((QByteArray *)&local_78);
  qVar5 = QByteArrayView::lengthHelperCharArray("close",6);
  bv_04.m_data = "close";
  bv_04.m_size = qVar5;
  bVar2 = QByteArray::contains((QByteArray *)&local_78,bv_04);
  if (bVar2) {
    this->connectionCloseEnabled = true;
  }
  else {
    qVar5 = QByteArrayView::lengthHelperCharArray("proxy-connection",0x11);
    local_c8.d = (Data *)0x0;
    local_c8.ptr = (char *)0x0;
    local_c8.size = 0;
    name_01.m_data = "proxy-connection";
    name_01.m_size = qVar5;
    QHttpNetworkHeaderPrivate::headerField
              ((QByteArray *)&local_b0,this_00,name_01,(QByteArray *)&local_c8);
    QByteArray::toLower_helper((QByteArray *)&local_98);
    qVar5 = QByteArrayView::lengthHelperCharArray("close",6);
    bv_05.m_data = "close";
    bv_05.m_size = qVar5;
    bVar2 = QByteArray::contains((QByteArray *)&local_98,bv_05);
    bVar1 = true;
    if (bVar2) {
LAB_001f5430:
      this->connectionCloseEnabled = bVar1;
    }
    else {
      iVar3 = QHttpHeaderParser::getMajorVersion(this_02);
      if (iVar3 != 1) {
LAB_001f542e:
        bVar1 = false;
        goto LAB_001f5430;
      }
      iVar3 = QHttpHeaderParser::getMinorVersion(this_02);
      if ((iVar3 != 0) || ((undefined1 *)local_58.size != (undefined1 *)0x0)) goto LAB_001f542e;
      qVar5 = QByteArrayView::lengthHelperCharArray("proxy-connection",0x11);
      local_118.d = (Data *)0x0;
      local_118.ptr = (char *)0x0;
      local_118.size = 0;
      name_02.m_data = "proxy-connection";
      name_02.m_size = qVar5;
      QHttpNetworkHeaderPrivate::headerField
                ((QByteArray *)&local_f8,this_00,name_02,(QByteArray *)&local_118);
      QByteArray::toLower_helper((QByteArray *)&local_e0);
      qVar5 = QByteArrayView::lengthHelperCharArray("keep-alive",0xb);
      bv_06.m_data = "keep-alive";
      bv_06.m_size = qVar5;
      bVar2 = QByteArray::contains((QByteArray *)&local_e0,bv_06);
      this->connectionCloseEnabled = !bVar2;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_e0);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_f8);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_118);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_b0);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
LAB_001f5474:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return qVar8;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readHeader(QIODevice *socket)
{
    if (fragment.isEmpty()) {
        // according to http://dev.opera.com/articles/view/mama-http-headers/ the average size of the header
        // block is 381 bytes.
        // reserve bytes. This is better than always append() which reallocs the byte array.
        fragment.reserve(512);
    }

    qint64 bytes = 0;
    char c = 0;
    bool allHeaders = false;
    qint64 haveRead = 0;
    do {
        haveRead = socket->read(&c, 1);
        if (haveRead == 0) {
            // read more later
            break;
        } else if (haveRead == -1) {
            // connection broke down
            return -1;
        } else {
            fragment.append(c);
            bytes++;

            if (c == '\n') {
                // check for possible header endings. As per HTTP rfc,
                // the header endings will be marked by CRLFCRLF. But
                // we will allow CRLFCRLF, CRLFLF, LFCRLF, LFLF
                if (fragment.endsWith("\n\r\n")
                    || fragment.endsWith("\n\n"))
                    allHeaders = true;

                // there is another case: We have no headers. Then the fragment equals just the line ending
                if ((fragment.size() == 2 && fragment.endsWith("\r\n"))
                    || (fragment.size() == 1 && fragment.endsWith("\n")))
                    allHeaders = true;
            }
        }
    } while (!allHeaders && haveRead > 0);

    // we received all headers now parse them
    if (allHeaders) {
        parseHeader(fragment);
        state = ReadingDataState;
        fragment.clear(); // next fragment
        bodyLength = contentLength(); // cache the length

        // cache isChunked() since it is called often
        chunkedTransferEncoding = headerField("transfer-encoding").toLower().contains("chunked");

        // cache isConnectionCloseEnabled since it is called often
        QByteArray connectionHeaderField = headerField("connection");
        // check for explicit indication of close or the implicit connection close of HTTP/1.0
        connectionCloseEnabled = (connectionHeaderField.toLower().contains("close") ||
            headerField("proxy-connection").toLower().contains("close")) ||
            (parser.getMajorVersion() == 1 && parser.getMinorVersion() == 0 &&
            (connectionHeaderField.isEmpty() && !headerField("proxy-connection").toLower().contains("keep-alive")));
    }
    return bytes;
}